

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileProcess.h
# Opt level: O3

bool __thiscall FileReader::findNext(FileReader *this,char *fileName)

{
  uchar uVar1;
  dirent *pdVar2;
  
  pdVar2 = readdir((DIR *)this->dir);
  this->ptr = (dirent *)pdVar2;
  if (pdVar2 != (dirent *)0x0) {
    if ((pdVar2->d_name[0] == '.') &&
       ((pdVar2->d_name[1] == '\0' || ((pdVar2->d_name[1] == '.' && (pdVar2->d_name[2] == '\0'))))))
    {
      pdVar2 = readdir((DIR *)this->dir);
      this->ptr = (dirent *)pdVar2;
      if (pdVar2 == (dirent *)0x0) {
        return false;
      }
    }
    uVar1 = pdVar2->d_type;
    if (uVar1 != '\x04') {
      if ((uVar1 != '\n') && (uVar1 != '\b')) {
        return true;
      }
      fileName[0] = '\0';
      fileName[1] = '\0';
      fileName[2] = '\0';
      fileName[3] = '\0';
      fileName[4] = '\0';
      fileName[5] = '\0';
      fileName[6] = '\0';
      fileName[7] = '\0';
      strcpy(fileName,this->ptr->d_name);
      return true;
    }
    puts("Base File Directory including sub-directory");
  }
  return false;
}

Assistant:

bool FileReader::findNext(char* fileName)
{
    if((ptr=readdir(dir)) != NULL)
    {
        if(strcmp(ptr->d_name,".")==0 || strcmp(ptr->d_name,"..")==0)    ///current dir OR parrent dir
        {
            /*even for reading the same directory,sometimes d_name may be . or .., just ignore it then it can work well*/
            //printf("File Reader end by . or ..");
            if((ptr=readdir(dir)) == NULL)return false;
        }
        if(ptr->d_type == 8 || ptr->d_type == 10)    ///file or link file
        {
            //printf("In FileReader: %s\n",ptr->d_name);
            memset(fileName,'\0',sizeof(fileName));
            strcpy(fileName,ptr->d_name);
        }
        else if(ptr->d_type == 4)    ///dir
        {
            printf("Base File Directory including sub-directory\n");
            //if((ptr=readdir(dir)) == NULL)return false;
            return false;
        }
        return true;
    }
    return false;
}